

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture3DLodControlTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture3DLodControlTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *this_01;
  TextureFormat TVar1;
  TextureFormat TVar2;
  FilterMode FVar3;
  TestLog *pTVar4;
  TestStatus *pTVar5;
  int i;
  int iVar6;
  deUint32 width;
  deUint32 height;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  TextureBinding *this_02;
  long lVar10;
  undefined4 extraout_var_00;
  Surface *pSVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar12;
  void *pvVar13;
  deUint32 dVar14;
  int iVar15;
  deUint32 dVar16;
  deUint32 dVar17;
  int iVar18;
  int iVar19;
  int x;
  int local_538;
  int local_530;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8 [2];
  undefined1 local_4d8 [48];
  undefined1 local_4a8 [44];
  int local_47c;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  Surface renderedFrame;
  undefined1 local_410 [40];
  Surface errorMask;
  LodPrecision lodPrec;
  Texture3DView local_3c0;
  TestStatus *local_3b0;
  PixelFormat pixelFormat;
  Vector<int,_4> res_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368 [6];
  IVec4 formatBitDepth;
  ReferenceParams refParams;
  undefined1 local_25c [24];
  undefined8 local_244;
  size_type sStack_23c;
  BVec4 local_234;
  undefined1 local_230 [32];
  _Alloc_hider local_210;
  undefined4 local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_200 [4];
  ios_base local_1b8 [268];
  TextureFormatInfo fmtInfo;
  Sampler sampler;
  TextureFormat *format;
  
  iVar6 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
  format = (TextureFormat *)CONCAT44(extraout_var,iVar6);
  tcu::getTextureFormatInfo(&fmtInfo,format);
  this_00 = &this->m_renderer;
  width = util::TextureRenderer::getRenderWidth(this_00);
  height = util::TextureRenderer::getRenderHeight(this_00);
  util::createSampler(&sampler,CLAMP_TO_EDGE,CLAMP_TO_EDGE,this->m_minFilter,NEAREST);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            (&refParams,TEXTURETYPE_3D,&sampler,LODMODE_EXACT);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,width,height);
  dVar17 = width + 3;
  if (-1 < (int)width) {
    dVar17 = width;
  }
  dVar14 = height + 3;
  if (-1 < (int)height) {
    dVar14 = height;
  }
  util::createSampler((Sampler *)local_230,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters).super_Texture3DTestCaseParameters.
                      super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                      minFilter,NEAREST);
  refParams.sampler.magFilter = local_230._16_4_;
  refParams.sampler.lodThreshold = (float)local_230._20_4_;
  refParams.sampler.normalizedCoords = (bool)local_230[0x18];
  refParams.sampler._25_3_ = local_230._25_3_;
  refParams.sampler.compare = local_230._28_4_;
  refParams.sampler.wrapS = local_230._0_4_;
  refParams.sampler.wrapT = local_230._4_4_;
  refParams.sampler.wrapR = local_230._8_4_;
  refParams.sampler.minFilter = local_230._12_4_;
  refParams.sampler._32_8_ = local_210._M_p;
  refParams.sampler.borderColor.v.uData[1] = local_208;
  refParams.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(*format);
  refParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  refParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  refParams.super_RenderParams.colorBias.m_data[2] = fmtInfo.lookupBias.m_data[2];
  refParams.super_RenderParams.colorBias.m_data[3] = fmtInfo.lookupBias.m_data[3];
  refParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  refParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  refParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  refParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  uVar7 = this->m_texHeight;
  if (this->m_texHeight < this->m_texWidth) {
    uVar7 = this->m_texWidth;
  }
  if ((int)uVar7 <= this->m_texDepth) {
    uVar7 = this->m_texDepth;
  }
  if (uVar7 == 0) {
    uVar8 = 0x20;
  }
  else {
    uVar8 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = uVar8 ^ 0x1f;
  }
  dVar17 = (int)dVar17 >> 2;
  iVar6 = (int)dVar14 >> 2;
  refParams.maxLevel = 0x1f - uVar8;
  local_530 = 0;
  iVar12 = 0;
  local_3b0 = __return_storage_ptr__;
  do {
    iVar9 = height - iVar12 * iVar6;
    if (iVar12 != 3) {
      iVar9 = iVar6;
    }
    iVar19 = 0;
    dVar14 = width;
    for (iVar18 = 0; iVar18 != 4; iVar18 = iVar18 + 1) {
      dVar16 = dVar17;
      if (iVar18 == 3) {
        dVar16 = dVar14;
      }
      getBasicTexCoord3D(&texCoord,local_530 + iVar18);
      (*(this->super_TestInstance)._vptr_TestInstance[3])
                (this,&refParams,(ulong)(uint)(local_530 + iVar18));
      util::TextureRenderer::setViewport
                (this_00,(float)iVar19,(float)(iVar12 * iVar6),(float)(int)dVar16,(float)iVar9);
      this_02 = util::TextureRenderer::getTextureBinding(this_00,0);
      util::TextureBinding::updateTextureViewMipLevels
                (this_02,refParams.baseLevel,refParams.maxLevel);
      dVar14 = dVar14 - dVar17;
      iVar19 = iVar19 + dVar17;
      util::TextureRenderer::renderQuad
                (this_00,&renderedFrame,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&refParams);
    }
    iVar12 = iVar12 + 1;
    local_530 = local_530 + 4;
  } while (iVar12 != 4);
  local_230._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_230);
  pixelFormat.redBits = formatBitDepth.m_data[0];
  pixelFormat.greenBits = formatBitDepth.m_data[1];
  pixelFormat.blueBits = formatBitDepth.m_data[2];
  pixelFormat.alphaBits = formatBitDepth.m_data[3];
  FVar3 = this->m_minFilter;
  tcu::Surface::Surface(&referenceFrame,width,height);
  tcu::Surface::Surface(&errorMask,width,height);
  lVar10 = 0;
  do {
    *(undefined4 *)(local_25c + lVar10 * 4) = 0x16;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 3;
  do {
    *(undefined4 *)(local_25c + lVar10 * 4) = 0x10;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  local_244._0_4_ = 0.0;
  local_244._4_4_ = 0.0;
  sStack_23c._0_4_ = 0.0;
  sStack_23c._4_4_ = 0.0;
  local_234.m_data[0] = true;
  local_234.m_data[1] = true;
  local_234.m_data[2] = true;
  local_234.m_data[3] = true;
  lodPrec.rule = RULE_VULKAN;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_25c._0_4_ = 0x14;
  local_25c._4_4_ = 0x14;
  local_25c._8_4_ = 0x14;
  local_25c._12_4_ = 0x10;
  local_25c._16_4_ = 0x10;
  local_25c._20_4_ = 0x10;
  local_4a8._0_4_ = pixelFormat.redBits;
  local_4a8._4_4_ = pixelFormat.greenBits;
  local_4a8._8_4_ = pixelFormat.blueBits;
  local_4a8._12_4_ = pixelFormat.alphaBits;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar10 = 0;
  do {
    res.m_data[lVar10] =
         *(int *)(local_4a8 + lVar10 * 4) +
         (-1 - (uint)((FVar3 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) == 0));
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_4d8._0_4_ = R;
  local_4d8._4_4_ = SNORM_INT8;
  local_4d8._8_8_ = 0;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  res_1.m_data[3] = 0;
  lVar10 = 0;
  do {
    iVar12 = *(int *)(local_4d8 + lVar10 * 4);
    if (*(int *)(local_4d8 + lVar10 * 4) < res.m_data[lVar10]) {
      iVar12 = res.m_data[lVar10];
    }
    res_1.m_data[lVar10] = iVar12;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  tcu::computeFixedPointThreshold((tcu *)local_230,&res_1);
  local_244._0_4_ = (float)local_230._0_4_;
  local_244._4_4_ = (float)local_230._4_4_;
  sStack_23c = local_230._8_8_;
  local_234.m_data[1] = 0 < pixelFormat.greenBits;
  local_234.m_data[0] = 0 < pixelFormat.redBits;
  local_234.m_data[2] = 0 < pixelFormat.blueBits;
  local_234.m_data[3] = 0 < pixelFormat.alphaBits;
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = 8;
  iVar12 = 0;
  iVar9 = 0;
  local_538 = 0;
  do {
    iVar19 = iVar9 * iVar6;
    iVar18 = height - iVar19;
    if (iVar9 != 3) {
      iVar18 = iVar6;
    }
    x = 0;
    iVar15 = 0;
    local_47c = iVar9;
    dVar14 = width;
    do {
      dVar16 = dVar17;
      if (iVar15 == 3) {
        dVar16 = dVar14;
      }
      getBasicTexCoord3D(&texCoord,iVar12 + iVar15);
      (*(this->super_TestInstance)._vptr_TestInstance[3])
                (this,&refParams,(ulong)(uint)(iVar12 + iVar15));
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_230,&referenceFrame,&pixelFormat,x,iVar19,dVar16,iVar18);
      res_1.m_data._8_8_ = format[10];
      res_1.m_data[0] = format[9].order;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_230,(Texture3DView *)&res_1,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&refParams);
      res.m_data[0] = 8;
      res.m_data[1] = 3;
      pvVar13 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar13 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res_1,(TextureFormat *)&res,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar13);
      tcu::getSubregion((PixelBufferAccess *)local_230,(PixelBufferAccess *)&res_1,x,iVar19,dVar16,
                        iVar18);
      local_4d8._0_4_ = RGBA;
      local_4d8._4_4_ = UNORM_INT8;
      pvVar13 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar13 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_4a8,(TextureFormat *)local_4d8,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar13);
      tcu::getSubregion((PixelBufferAccess *)&res,(PixelBufferAccess *)local_4a8,x,iVar19,dVar16,
                        iVar18);
      local_3c0.m_numLevels = 8;
      local_3c0._4_4_ = 3;
      pvVar13 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar13 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_410,(TextureFormat *)&local_3c0,errorMask.m_width,
                 errorMask.m_height,1,pvVar13);
      tcu::getSubregion((PixelBufferAccess *)local_4d8,(PixelBufferAccess *)local_410,x,iVar19,
                        dVar16,iVar18);
      iVar9 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      local_3c0.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_00,iVar9) + 0x50);
      local_3c0.m_numLevels = *(int *)(CONCAT44(extraout_var_00,iVar9) + 0x48);
      iVar9 = glu::TextureTestUtil::computeTextureLookupDiff
                        ((ConstPixelBufferAccess *)local_230,(ConstPixelBufferAccess *)&res,
                         (PixelBufferAccess *)local_4d8,&local_3c0,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,&refParams,(LookupPrecision *)local_25c,
                         &lodPrec,((this->super_TestInstance).m_context)->m_testCtx->m_watchDog);
      iVar15 = iVar15 + 1;
      local_538 = local_538 + iVar9;
      dVar14 = dVar14 - dVar17;
      x = x + dVar17;
    } while (iVar15 != 4);
    iVar9 = local_47c + 1;
    iVar12 = iVar12 + 4;
  } while (iVar9 != 4);
  if (0 < local_538) {
    local_230._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    this_01 = (ostringstream *)(local_230 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"ERROR: Image verification failed, found ",0x28);
    std::ostream::operator<<(this_01,local_538);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    std::ios_base::~ios_base(local_1b8);
  }
  pTVar4 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  res.m_data._0_8_ = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Result","");
  local_4a8._0_8_ = (long)local_4a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&res_1,(string *)&res,(string *)local_4a8);
  tcu::TestLog::startImageSet(pTVar4,(char *)res_1.m_data._0_8_,local_378._M_p);
  local_4d8._0_8_ = (long)local_4d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"Rendered","");
  TVar1 = (TextureFormat)((long)local_410 + 0x10);
  local_410._0_8_ = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Rendered image","");
  pSVar11 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)local_230,(string *)local_4d8,(string *)local_410,pSVar11,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_230,(int)pTVar4,__buf,(size_t)pSVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_p != aaStack_200) {
    operator_delete(local_210._M_p,
                    CONCAT44(aaStack_200[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_200[0]._M_allocated_capacity) + 1);
  }
  TVar2 = (TextureFormat)((long)local_230 + 0x10);
  if ((TextureFormat)local_230._0_8_ != TVar2) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  if ((TextureFormat)local_410._0_8_ != TVar1) {
    operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
  }
  if (local_4d8._0_8_ != (long)local_4d8 + 0x10) {
    operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_p != local_368) {
    operator_delete(local_378._M_p,local_368[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_1.m_data._0_8_ != &local_388) {
    operator_delete((void *)res_1.m_data._0_8_,local_388._M_allocated_capacity + 1);
  }
  if (local_4a8._0_8_ != (long)local_4a8 + 0x10) {
    operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != local_4f8) {
    operator_delete((void *)res.m_data._0_8_,local_4f8[0]._M_allocated_capacity + 1);
  }
  if (0 < local_538) {
    pTVar4 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    res.m_data._0_8_ = local_4f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Reference","");
    local_4a8._0_8_ = (long)local_4a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Ideal reference","");
    pSVar11 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)local_230,(string *)&res,(string *)local_4a8,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar6 = (int)pTVar4;
    tcu::LogImage::write((LogImage *)local_230,iVar6,__buf_00,(size_t)pSVar11);
    local_4d8._0_8_ = (long)local_4d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"ErrorMask","");
    local_410._0_8_ = TVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Error mask","");
    pSVar11 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res_1,(string *)local_4d8,(string *)local_410,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res_1,iVar6,__buf_01,(size_t)pSVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_p != local_368) {
      operator_delete(local_378._M_p,local_368[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res_1.m_data._0_8_ != &local_388) {
      operator_delete((void *)res_1.m_data._0_8_,local_388._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_410._0_8_ != TVar1) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    if (local_4d8._0_8_ != (long)local_4d8 + 0x10) {
      operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_p != aaStack_200) {
      operator_delete(local_210._M_p,
                      CONCAT44(aaStack_200[0]._M_allocated_capacity._4_4_,
                               (undefined4)aaStack_200[0]._M_allocated_capacity) + 1);
    }
    if ((TextureFormat)local_230._0_8_ != TVar2) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
    if (local_4a8._0_8_ != (long)local_4a8 + 0x10) {
      operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res.m_data._0_8_ != local_4f8) {
      operator_delete((void *)res.m_data._0_8_,local_4f8[0]._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestInstance).m_context)->m_testCtx->m_log);
  pTVar5 = local_3b0;
  local_230._0_8_ = TVar2;
  if (local_538 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"pass","");
    pTVar5->m_code = QP_TEST_RESULT_PASS;
    (pTVar5->m_description)._M_dataplus._M_p = (pointer)&(pTVar5->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar5->m_description,local_230._0_8_,local_230._8_8_ + local_230._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"fail","");
    pTVar5->m_code = QP_TEST_RESULT_FAIL;
    (pTVar5->m_description)._M_dataplus._M_p = (pointer)&(pTVar5->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar5->m_description,local_230._0_8_,local_230._8_8_ + local_230._0_8_);
  }
  if ((TextureFormat)local_230._0_8_ != TVar2) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pTVar5;
}

Assistant:

tcu::TestStatus Texture3DLodControlTestInstance::iterate (void)
{
	const tcu::Sampler::WrapMode	wrapS			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::WrapMode	wrapT			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::WrapMode	wrapR			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::FilterMode	magFilter		= Sampler::NEAREST;

	const tcu::Texture3D&			refTexture		= m_texture->getTexture();
	const tcu::TextureFormat&		texFmt			= refTexture.getFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const int						viewportWidth	= m_renderer.getRenderWidth();
	const int						viewportHeight	= m_renderer.getRenderHeight();

	tcu::Sampler					sampler			= util::createSampler(wrapS, wrapT, m_minFilter, magFilter);
	ReferenceParams					refParams		(TEXTURETYPE_3D, sampler);
	vector<float>					texCoord;
	tcu::Surface					renderedFrame	(viewportWidth, viewportHeight);

	// Viewport is divided into 4x4 grid.
	const int						gridWidth		= 4;
	const int						gridHeight		= 4;
	const int						cellWidth		= viewportWidth / gridWidth;
	const int						cellHeight		= viewportHeight / gridHeight;

	// Sampling parameters.
	refParams.sampler		= util::createSampler(wrapS, wrapT, wrapR, m_testParameters.minFilter, magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;
	refParams.maxLevel		= deLog2Floor32(de::max(de::max(m_texWidth, m_texHeight), m_texDepth));

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int	curX		= cellWidth*gridX;
			const int	curY		= cellHeight*gridY;
			const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
			const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
			const int	cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			getBasicTexCoord3D(texCoord, cellNdx);

			getReferenceParams(refParams,cellNdx);
			//Render
			m_renderer.setViewport((float)curX, (float)curY, (float)curW, (float)curH);
			m_renderer.getTextureBinding(0)->updateTextureViewMipLevels(refParams.baseLevel, refParams.maxLevel);
			m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
		}
	}

	// Compare and log
	{
		const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		const bool				isTrilinear		= m_minFilter == Sampler::NEAREST_MIPMAP_LINEAR || m_minFilter == Sampler::LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewportWidth, viewportHeight);
		tcu::Surface			errorMask		(viewportWidth, viewportHeight);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_VULKAN);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 20);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 16); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int	curX		= cellWidth*gridX;
				const int	curY		= cellHeight*gridY;
				const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
				const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
				const int	cellNdx		= gridY*gridWidth + gridX;

				getBasicTexCoord3D(texCoord, cellNdx);
				getReferenceParams(refParams, cellNdx);

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], refParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getTexture(), &texCoord[0], refParams,
															lookupPrec, lodPrec, m_context.getTestContext().getWatchDog());
			}
		}

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;
		}

		m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}